

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O2

int get_param_part(OperationConfig *config,char endchar,char **str,char **pdata,char **ptype,
                  char **pfilename,char **pencoder,curl_slist **pheaders)

{
  byte bVar1;
  _Bool _Var2;
  GlobalConfig *config_00;
  FILE *pFVar3;
  CURL **ppCVar4;
  curl_slist *pcVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  OperationConfig *pOVar10;
  size_t sVar11;
  size_t sVar12;
  OperationConfig *pOVar13;
  FILE *__stream;
  OperationConfig *pOVar15;
  int *piVar16;
  char *pcVar17;
  char endchar_00;
  OperationConfig *pOVar18;
  undefined7 in_register_00000031;
  long lVar19;
  long lVar20;
  OperationConfig *pOVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  OperationConfig *local_588;
  OperationConfig *local_580;
  uint local_574;
  OperationConfig *local_570;
  int local_568;
  uint local_564;
  curl_slist *headers;
  uint local_554;
  OperationConfig *local_550;
  OperationConfig *local_548;
  OperationConfig *local_540;
  OperationConfig *local_538;
  char **local_530;
  char **local_528;
  char **local_520;
  char type_minor [128];
  char type_major [128];
  char local_418 [1000];
  ulong uVar14;
  
  local_588 = (OperationConfig *)*str;
  type_major[0x70] = '\0';
  type_major[0x71] = '\0';
  type_major[0x72] = '\0';
  type_major[0x73] = '\0';
  type_major[0x74] = '\0';
  type_major[0x75] = '\0';
  type_major[0x76] = '\0';
  type_major[0x77] = '\0';
  type_major[0x78] = '\0';
  type_major[0x79] = '\0';
  type_major[0x7a] = '\0';
  type_major[0x7b] = '\0';
  type_major[0x7c] = '\0';
  type_major[0x7d] = '\0';
  type_major[0x7e] = '\0';
  type_major[0x7f] = '\0';
  type_major[0x60] = '\0';
  type_major[0x61] = '\0';
  type_major[0x62] = '\0';
  type_major[99] = '\0';
  type_major[100] = '\0';
  type_major[0x65] = '\0';
  type_major[0x66] = '\0';
  type_major[0x67] = '\0';
  type_major[0x68] = '\0';
  type_major[0x69] = '\0';
  type_major[0x6a] = '\0';
  type_major[0x6b] = '\0';
  type_major[0x6c] = '\0';
  type_major[0x6d] = '\0';
  type_major[0x6e] = '\0';
  type_major[0x6f] = '\0';
  type_major[0x50] = '\0';
  type_major[0x51] = '\0';
  type_major[0x52] = '\0';
  type_major[0x53] = '\0';
  type_major[0x54] = '\0';
  type_major[0x55] = '\0';
  type_major[0x56] = '\0';
  type_major[0x57] = '\0';
  type_major[0x58] = '\0';
  type_major[0x59] = '\0';
  type_major[0x5a] = '\0';
  type_major[0x5b] = '\0';
  type_major[0x5c] = '\0';
  type_major[0x5d] = '\0';
  type_major[0x5e] = '\0';
  type_major[0x5f] = '\0';
  type_major[0x40] = '\0';
  type_major[0x41] = '\0';
  type_major[0x42] = '\0';
  type_major[0x43] = '\0';
  type_major[0x44] = '\0';
  type_major[0x45] = '\0';
  type_major[0x46] = '\0';
  type_major[0x47] = '\0';
  type_major[0x48] = '\0';
  type_major[0x49] = '\0';
  type_major[0x4a] = '\0';
  type_major[0x4b] = '\0';
  type_major[0x4c] = '\0';
  type_major[0x4d] = '\0';
  type_major[0x4e] = '\0';
  type_major[0x4f] = '\0';
  type_major[0x30] = '\0';
  type_major[0x31] = '\0';
  type_major[0x32] = '\0';
  type_major[0x33] = '\0';
  type_major[0x34] = '\0';
  type_major[0x35] = '\0';
  type_major[0x36] = '\0';
  type_major[0x37] = '\0';
  type_major[0x38] = '\0';
  type_major[0x39] = '\0';
  type_major[0x3a] = '\0';
  type_major[0x3b] = '\0';
  type_major[0x3c] = '\0';
  type_major[0x3d] = '\0';
  type_major[0x3e] = '\0';
  type_major[0x3f] = '\0';
  type_major[0x20] = '\0';
  type_major[0x21] = '\0';
  type_major[0x22] = '\0';
  type_major[0x23] = '\0';
  type_major[0x24] = '\0';
  type_major[0x25] = '\0';
  type_major[0x26] = '\0';
  type_major[0x27] = '\0';
  type_major[0x28] = '\0';
  type_major[0x29] = '\0';
  type_major[0x2a] = '\0';
  type_major[0x2b] = '\0';
  type_major[0x2c] = '\0';
  type_major[0x2d] = '\0';
  type_major[0x2e] = '\0';
  type_major[0x2f] = '\0';
  type_major[0x10] = '\0';
  type_major[0x11] = '\0';
  type_major[0x12] = '\0';
  type_major[0x13] = '\0';
  type_major[0x14] = '\0';
  type_major[0x15] = '\0';
  type_major[0x16] = '\0';
  type_major[0x17] = '\0';
  type_major[0x18] = '\0';
  type_major[0x19] = '\0';
  type_major[0x1a] = '\0';
  type_major[0x1b] = '\0';
  type_major[0x1c] = '\0';
  type_major[0x1d] = '\0';
  type_major[0x1e] = '\0';
  type_major[0x1f] = '\0';
  type_major[0] = '\0';
  type_major[1] = '\0';
  type_major[2] = '\0';
  type_major[3] = '\0';
  type_major[4] = '\0';
  type_major[5] = '\0';
  type_major[6] = '\0';
  type_major[7] = '\0';
  type_major[8] = '\0';
  type_major[9] = '\0';
  type_major[10] = '\0';
  type_major[0xb] = '\0';
  type_major[0xc] = '\0';
  type_major[0xd] = '\0';
  type_major[0xe] = '\0';
  type_major[0xf] = '\0';
  type_minor[0x70] = '\0';
  type_minor[0x71] = '\0';
  type_minor[0x72] = '\0';
  type_minor[0x73] = '\0';
  type_minor[0x74] = '\0';
  type_minor[0x75] = '\0';
  type_minor[0x76] = '\0';
  type_minor[0x77] = '\0';
  type_minor[0x78] = '\0';
  type_minor[0x79] = '\0';
  type_minor[0x7a] = '\0';
  type_minor[0x7b] = '\0';
  type_minor[0x7c] = '\0';
  type_minor[0x7d] = '\0';
  type_minor[0x7e] = '\0';
  type_minor[0x7f] = '\0';
  type_minor[0x60] = '\0';
  type_minor[0x61] = '\0';
  type_minor[0x62] = '\0';
  type_minor[99] = '\0';
  type_minor[100] = '\0';
  type_minor[0x65] = '\0';
  type_minor[0x66] = '\0';
  type_minor[0x67] = '\0';
  type_minor[0x68] = '\0';
  type_minor[0x69] = '\0';
  type_minor[0x6a] = '\0';
  type_minor[0x6b] = '\0';
  type_minor[0x6c] = '\0';
  type_minor[0x6d] = '\0';
  type_minor[0x6e] = '\0';
  type_minor[0x6f] = '\0';
  type_minor[0x50] = '\0';
  type_minor[0x51] = '\0';
  type_minor[0x52] = '\0';
  type_minor[0x53] = '\0';
  type_minor[0x54] = '\0';
  type_minor[0x55] = '\0';
  type_minor[0x56] = '\0';
  type_minor[0x57] = '\0';
  type_minor[0x58] = '\0';
  type_minor[0x59] = '\0';
  type_minor[0x5a] = '\0';
  type_minor[0x5b] = '\0';
  type_minor[0x5c] = '\0';
  type_minor[0x5d] = '\0';
  type_minor[0x5e] = '\0';
  type_minor[0x5f] = '\0';
  type_minor[0x40] = '\0';
  type_minor[0x41] = '\0';
  type_minor[0x42] = '\0';
  type_minor[0x43] = '\0';
  type_minor[0x44] = '\0';
  type_minor[0x45] = '\0';
  type_minor[0x46] = '\0';
  type_minor[0x47] = '\0';
  type_minor[0x48] = '\0';
  type_minor[0x49] = '\0';
  type_minor[0x4a] = '\0';
  type_minor[0x4b] = '\0';
  type_minor[0x4c] = '\0';
  type_minor[0x4d] = '\0';
  type_minor[0x4e] = '\0';
  type_minor[0x4f] = '\0';
  type_minor[0x30] = '\0';
  type_minor[0x31] = '\0';
  type_minor[0x32] = '\0';
  type_minor[0x33] = '\0';
  type_minor[0x34] = '\0';
  type_minor[0x35] = '\0';
  type_minor[0x36] = '\0';
  type_minor[0x37] = '\0';
  type_minor[0x38] = '\0';
  type_minor[0x39] = '\0';
  type_minor[0x3a] = '\0';
  type_minor[0x3b] = '\0';
  type_minor[0x3c] = '\0';
  type_minor[0x3d] = '\0';
  type_minor[0x3e] = '\0';
  type_minor[0x3f] = '\0';
  type_minor[0x20] = '\0';
  type_minor[0x21] = '\0';
  type_minor[0x22] = '\0';
  type_minor[0x23] = '\0';
  type_minor[0x24] = '\0';
  type_minor[0x25] = '\0';
  type_minor[0x26] = '\0';
  type_minor[0x27] = '\0';
  type_minor[0x28] = '\0';
  type_minor[0x29] = '\0';
  type_minor[0x2a] = '\0';
  type_minor[0x2b] = '\0';
  type_minor[0x2c] = '\0';
  type_minor[0x2d] = '\0';
  type_minor[0x2e] = '\0';
  type_minor[0x2f] = '\0';
  type_minor[0x10] = '\0';
  type_minor[0x11] = '\0';
  type_minor[0x12] = '\0';
  type_minor[0x13] = '\0';
  type_minor[0x14] = '\0';
  type_minor[0x15] = '\0';
  type_minor[0x16] = '\0';
  type_minor[0x17] = '\0';
  type_minor[0x18] = '\0';
  type_minor[0x19] = '\0';
  type_minor[0x1a] = '\0';
  type_minor[0x1b] = '\0';
  type_minor[0x1c] = '\0';
  type_minor[0x1d] = '\0';
  type_minor[0x1e] = '\0';
  type_minor[0x1f] = '\0';
  type_minor[0] = '\0';
  type_minor[1] = '\0';
  type_minor[2] = '\0';
  type_minor[3] = '\0';
  type_minor[4] = '\0';
  type_minor[5] = '\0';
  type_minor[6] = '\0';
  type_minor[7] = '\0';
  type_minor[8] = '\0';
  type_minor[9] = '\0';
  type_minor[10] = '\0';
  type_minor[0xb] = '\0';
  type_minor[0xc] = '\0';
  type_minor[0xd] = '\0';
  type_minor[0xe] = '\0';
  type_minor[0xf] = '\0';
  headers = (curl_slist *)0x0;
  if (ptype != (char **)0x0) {
    *ptype = (char *)0x0;
  }
  if (pfilename != (char **)0x0) {
    *pfilename = (char *)0x0;
  }
  if (pheaders != (curl_slist **)0x0) {
    *pheaders = (curl_slist *)0x0;
  }
  if (pencoder != (char **)0x0) {
    *pencoder = (char *)0x0;
  }
  pOVar18 = (OperationConfig *)((long)&local_588[-1].next + 7);
  pOVar15 = (OperationConfig *)pencoder;
  local_570 = config;
  local_530 = ptype;
  local_520 = str;
  do {
    ppCVar4 = &pOVar18->easy;
    pOVar18 = (OperationConfig *)((long)&pOVar18->easy + 1);
    iVar6 = Curl_isspace((uint)*(byte *)((long)ppCVar4 + 1));
  } while (iVar6 != 0);
  local_564 = (uint)CONCAT71(in_register_00000031,endchar);
  local_568 = (int)endchar;
  local_588 = pOVar18;
  pOVar10 = (OperationConfig *)get_param_word((char **)&local_588,(char **)&local_580,endchar);
  *pdata = (char *)pOVar10;
  pOVar21 = local_580;
  local_528 = pfilename;
  if (pOVar18 == pOVar10) {
    do {
      local_580 = pOVar21;
      if (pOVar21 <= (OperationConfig *)*pdata) break;
      iVar6 = Curl_isspace((uint)*(byte *)((long)&pOVar21[-1].next + 7));
      pOVar21 = (OperationConfig *)((long)&pOVar21[-1].next + 7);
    } while (iVar6 != 0);
  }
  bVar1 = *(byte *)&local_588->easy;
  *(char *)&local_580->easy = '\0';
  pOVar18 = (OperationConfig *)0x0;
  local_550 = (OperationConfig *)0x0;
  local_538 = (OperationConfig *)0x0;
  local_540 = (OperationConfig *)0x0;
  iVar6 = local_568;
  uVar8 = local_564;
  uVar9 = (uint)bVar1;
  pOVar21 = local_588;
LAB_0010de5a:
  do {
    while( true ) {
      while( true ) {
        local_588 = pOVar21;
        pOVar10 = local_538;
        pOVar21 = local_550;
        pOVar13 = local_588;
        if ((char)uVar9 != ';') {
          if (pOVar18 != (OperationConfig *)0x0) {
            *(char *)&pOVar18->easy = '\0';
          }
          if (local_530 == (char **)0x0) {
            if (local_540 != (OperationConfig *)0x0) {
              warnf(local_570->global,"Field content type not allowed here: %s\n");
            }
          }
          else {
            *local_530 = (char *)local_540;
          }
          if (local_528 == (char **)0x0) {
            if (pOVar10 != (OperationConfig *)0x0) {
              warnf(local_570->global,"Field file name not allowed here: %s\n",pOVar10);
            }
          }
          else {
            *local_528 = (char *)pOVar10;
          }
          if (pencoder == (char **)0x0) {
            if (pOVar21 != (OperationConfig *)0x0) {
              warnf(local_570->global,"Field encoder not allowed here: %s\n",pOVar21);
            }
          }
          else {
            *pencoder = (char *)pOVar21;
          }
          pcVar5 = headers;
          if (pheaders == (curl_slist **)0x0) {
            if (headers != (curl_slist *)0x0) {
              warnf(local_570->global,"Field headers not allowed here: %s\n",headers->data);
              curl_slist_free_all(pcVar5);
            }
          }
          else {
            *pheaders = headers;
          }
          *local_520 = (char *)local_588;
          return uVar9 & 0xff;
        }
        do {
          pOVar21 = pOVar13;
          pOVar13 = (OperationConfig *)((long)&pOVar21->easy + 1);
          iVar7 = Curl_isspace((uint)*(byte *)((long)&pOVar21->easy + 1));
        } while (iVar7 != 0);
        local_588 = pOVar13;
        if ((pOVar18 != (OperationConfig *)0x0) ||
           (iVar7 = curl_strnequal("type=",pOVar13,5), iVar7 == 0)) break;
        pOVar18 = (OperationConfig *)((long)&pOVar21->easy + 6);
        do {
          pOVar21 = pOVar18;
          local_588 = pOVar21;
          iVar7 = Curl_isspace((uint)*(_Bool *)&pOVar21->easy);
          pOVar18 = (OperationConfig *)((long)&pOVar21->easy + 1);
        } while (iVar7 != 0);
        pOVar15 = (OperationConfig *)type_minor;
        local_540 = pOVar21;
        iVar7 = __isoc99_sscanf(pOVar21,"%127[^/ ]/%127[^;, \n]",type_major,
                                (OperationConfig *)type_minor);
        if (iVar7 != 2) {
          warnf(local_570->global,"Illegally formatted content-type field!\n");
          goto LAB_0010e541;
        }
        sVar11 = strlen(type_major);
        sVar12 = strlen(type_minor);
        pOVar21 = (OperationConfig *)((long)&pOVar18->easy + sVar12 + sVar11);
        pOVar18 = pOVar21;
        while( true ) {
          bVar1 = *(byte *)&pOVar21->easy;
          uVar9 = (uint)bVar1;
          if (((bVar1 == 0) || (bVar1 == 0x3b)) || (uVar9 = uVar8, bVar1 == (byte)uVar8)) break;
          local_588 = pOVar21;
          iVar7 = Curl_isspace((uint)bVar1);
          pOVar21 = (OperationConfig *)((long)&pOVar21->easy + 1);
          if (iVar7 == 0) {
            pOVar18 = pOVar21;
          }
        }
      }
      iVar7 = curl_strnequal("filename=",pOVar13,9);
      endchar_00 = (char)iVar6;
      if (iVar7 == 0) break;
      if (pOVar18 != (OperationConfig *)0x0) {
        *(char *)&pOVar18->easy = '\0';
      }
      pOVar18 = (OperationConfig *)&local_588->remote_time;
      do {
        ppCVar4 = &pOVar18->easy;
        pOVar18 = (OperationConfig *)((long)&pOVar18->easy + 1);
        iVar7 = Curl_isspace((uint)*(byte *)((long)ppCVar4 + 1));
      } while (iVar7 != 0);
      local_588 = pOVar18;
      local_538 = (OperationConfig *)
                  get_param_word((char **)&local_588,(char **)&local_580,endchar_00);
      pOVar21 = local_580;
      pOVar10 = local_580;
      if (pOVar18 == local_538) {
        do {
          pOVar10 = pOVar21;
          if (pOVar10 <= pOVar18) break;
          iVar7 = Curl_isspace((uint)*(byte *)((long)&pOVar10[-1].next + 7));
          pOVar21 = (OperationConfig *)((long)&pOVar10[-1].next + 7);
        } while (iVar7 != 0);
      }
LAB_0010df0a:
      local_580 = pOVar10;
      bVar1 = *(byte *)&local_588->easy;
      *(char *)&local_580->easy = '\0';
      pOVar18 = (OperationConfig *)0x0;
      uVar9 = (uint)bVar1;
      pOVar21 = local_588;
    }
    iVar7 = curl_strnequal("headers=",pOVar13,8);
    if (iVar7 == 0) {
      iVar7 = curl_strnequal("encoder=",pOVar13,8);
      if (iVar7 != 0) {
        if (pOVar18 != (OperationConfig *)0x0) {
          *(char *)&pOVar18->easy = '\0';
        }
        pOVar18 = (OperationConfig *)((long)&local_588->easy + 7);
        do {
          ppCVar4 = &pOVar18->easy;
          pOVar18 = (OperationConfig *)((long)&pOVar18->easy + 1);
          iVar7 = Curl_isspace((uint)*(byte *)((long)ppCVar4 + 1));
        } while (iVar7 != 0);
        local_588 = pOVar18;
        local_550 = (OperationConfig *)
                    get_param_word((char **)&local_588,(char **)&local_580,endchar_00);
        pOVar21 = local_580;
        pOVar10 = local_580;
        if (pOVar18 == local_550) {
          do {
            pOVar10 = pOVar21;
            if (pOVar10 <= pOVar18) break;
            iVar7 = Curl_isspace((uint)*(byte *)((long)&pOVar10[-1].next + 7));
            pOVar21 = (OperationConfig *)((long)&pOVar10[-1].next + 7);
          } while (iVar7 != 0);
        }
        goto LAB_0010df0a;
      }
      bVar24 = pOVar18 == (OperationConfig *)0x0;
      pOVar18 = pOVar13;
      pOVar21 = local_588;
      if (bVar24) {
        pcVar17 = get_param_word((char **)&local_588,(char **)&local_580,endchar_00);
        bVar1 = *(byte *)&local_588->easy;
        *(char *)&local_580->easy = '\0';
        pOVar18 = (OperationConfig *)0x0;
        pOVar15 = local_580;
        uVar9 = (uint)bVar1;
        pOVar21 = local_588;
        if (*pcVar17 != '\0') {
          pOVar15 = local_570;
          warnf(local_570->global,"skip unknown form field: %s\n",pcVar17);
          pOVar18 = (OperationConfig *)0x0;
          pOVar21 = local_588;
        }
      }
      else {
        while( true ) {
          bVar1 = *(byte *)&pOVar21->easy;
          uVar9 = (uint)bVar1;
          if (((bVar1 == 0) || (bVar1 == 0x3b)) || (uVar9 = uVar8, bVar1 == (byte)uVar8)) break;
          iVar7 = Curl_isspace((uint)bVar1);
          pOVar21 = (OperationConfig *)((long)&pOVar21->easy + 1);
          if (iVar7 == 0) {
            pOVar18 = pOVar21;
          }
        }
      }
      goto LAB_0010de5a;
    }
    if (pOVar18 != (OperationConfig *)0x0) {
      *(char *)&pOVar18->easy = '\0';
    }
    if ((local_588->remote_time == true) || (local_588->remote_time == true)) {
      pOVar18 = (OperationConfig *)&local_588->remote_time;
      do {
        ppCVar4 = &pOVar18->easy;
        pOVar18 = (OperationConfig *)((long)&pOVar18->easy + 1);
        iVar6 = Curl_isspace((uint)*(byte *)((long)ppCVar4 + 1));
      } while (iVar6 != 0);
      local_588 = pOVar18;
      pOVar13 = (OperationConfig *)
                get_param_word((char **)&local_588,(char **)&local_580,endchar_00);
      pOVar21 = local_580;
      pOVar10 = local_580;
      if (pOVar18 == pOVar13) {
        do {
          pOVar10 = pOVar21;
          if (pOVar10 <= pOVar18) break;
          iVar6 = Curl_isspace((uint)*(byte *)((long)&pOVar10[-1].next + 7));
          pOVar21 = (OperationConfig *)((long)&pOVar10[-1].next + 7);
        } while (iVar6 != 0);
      }
      local_580 = pOVar10;
      _Var2 = *(_Bool *)&local_588->easy;
      *(char *)&local_580->easy = '\0';
      __stream = fopen64((char *)pOVar13,"r");
      if (__stream != (FILE *)0x0) {
        uVar23 = 0;
        local_554 = 1;
        local_548 = pOVar13;
LAB_0010e09a:
        lVar19 = 0;
        do {
          local_574 = 0;
LAB_0010e0a5:
          do {
            do {
              lVar20 = lVar19;
              uVar8 = getc(__stream);
              uVar14 = (ulong)uVar8;
              if (uVar8 == 0xffffffff) {
LAB_0010e0c8:
                do {
                  uVar22 = uVar23;
                  if (uVar22 == 0) goto LAB_0010e106;
                  uVar9 = Curl_isspace((uint)(byte)type_major[uVar22 + 0x7f]);
                  uVar14 = (ulong)uVar9;
                  uVar23 = uVar22 - 1;
                } while (uVar9 != 0);
                local_418[uVar22] = '\0';
                uVar9 = slist_append(&headers,local_418);
                uVar14 = (ulong)uVar9;
                if (uVar9 == 0) {
LAB_0010e106:
                  uVar23 = 0;
                  goto LAB_0010e109;
                }
                curl_mfprintf(local_570->global->errors,"Out of memory for field headers!\n");
LAB_0010e40e:
                fclose(__stream);
                goto LAB_0010e541;
              }
              if (lVar20 == 0) {
                uVar9 = Curl_isspace(uVar8 & 0xff);
                uVar14 = (ulong)uVar9;
                if (uVar9 == 0) goto LAB_0010e0c8;
              }
LAB_0010e109:
              lVar19 = lVar20;
            } while (uVar8 == 0xd);
            if (uVar8 == 0x23) {
              pOVar15 = (OperationConfig *)CONCAT71((int7)((ulong)pOVar15 >> 8),1);
              uVar9 = local_574 & 1;
              lVar19 = lVar20 + 1;
              local_574 = (uint)pOVar15;
              if (lVar20 == 0 || uVar9 != 0) goto LAB_0010e0a5;
            }
            else {
              if (uVar8 == 10) {
                local_554 = local_554 + 1;
                goto LAB_0010e09a;
              }
              if (uVar8 == 0xffffffff) {
                iVar6 = ferror(__stream);
                if (iVar6 != 0) {
                  pFVar3 = local_570->global->errors;
                  piVar16 = __errno_location();
                  pcVar17 = strerror(*piVar16);
                  curl_mfprintf(pFVar3,"Header file %s read error: %s\n",local_548,pcVar17);
                  goto LAB_0010e40e;
                }
                fclose(__stream);
                uVar8 = local_564;
                goto LAB_0010e321;
              }
              uVar9 = local_574 & 1;
              local_574 = (uint)CONCAT71((int7)(uVar14 >> 8),1);
              lVar19 = lVar20 + 1;
              if (uVar9 != 0) goto LAB_0010e0a5;
            }
            lVar19 = lVar20 + 1;
            if (uVar23 == 0x3e6) {
              pOVar15 = (OperationConfig *)(ulong)local_554;
              warnf(local_570->global,"File %s line %d: header too long (truncated)\n",local_548,
                    pOVar15);
              uVar8 = 0x20;
              break;
            }
            local_574 = 0;
          } while (0x3e6 < uVar23);
          local_418[uVar23] = (char)uVar8;
          uVar23 = uVar23 + 1;
        } while( true );
      }
      config_00 = local_570->global;
      piVar16 = __errno_location();
      pOVar15 = (OperationConfig *)strerror(*piVar16);
      warnf(config_00,"Cannot read from %s: %s\n",pOVar13,pOVar15);
LAB_0010e321:
      pOVar18 = (OperationConfig *)0x0;
      iVar6 = local_568;
      uVar9 = (uint)_Var2;
      pOVar21 = local_588;
    }
    else {
      pOVar18 = (OperationConfig *)((long)&local_588->easy + 7);
      do {
        ppCVar4 = &pOVar18->easy;
        pOVar18 = (OperationConfig *)((long)&pOVar18->easy + 1);
        iVar7 = Curl_isspace((uint)*(byte *)((long)ppCVar4 + 1));
      } while (iVar7 != 0);
      local_588 = pOVar18;
      pOVar13 = (OperationConfig *)
                get_param_word((char **)&local_588,(char **)&local_580,endchar_00);
      pOVar21 = local_580;
      pOVar10 = local_580;
      if (pOVar18 == pOVar13) {
        do {
          pOVar10 = pOVar21;
          if (pOVar10 <= pOVar18) break;
          iVar7 = Curl_isspace((uint)*(byte *)((long)&pOVar10[-1].next + 7));
          pOVar21 = (OperationConfig *)((long)&pOVar10[-1].next + 7);
        } while (iVar7 != 0);
      }
      local_580 = pOVar10;
      _Var2 = *(_Bool *)&local_588->easy;
      *(char *)&local_580->easy = '\0';
      iVar7 = slist_append(&headers,(char *)pOVar13);
      pOVar18 = (OperationConfig *)0x0;
      uVar8 = local_564;
      uVar9 = (uint)_Var2;
      pOVar21 = local_588;
      if (iVar7 != 0) {
        curl_mfprintf(local_570->global->errors,"Out of memory for field header!\n");
LAB_0010e541:
        curl_slist_free_all(headers);
        return -1;
      }
    }
  } while( true );
}

Assistant:

static int get_param_part(struct OperationConfig *config, char endchar,
                          char **str, char **pdata, char **ptype,
                          char **pfilename, char **pencoder,
                          struct curl_slist **pheaders)
{
  char *p = *str;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  char *endpos;
  char *tp;
  char sep;
  char type_major[128] = "";
  char type_minor[128] = "";
  char *endct = NULL;
  struct curl_slist *headers = NULL;

  if(ptype)
    *ptype = NULL;
  if(pfilename)
    *pfilename = NULL;
  if(pheaders)
    *pheaders = NULL;
  if(pencoder)
    *pencoder = NULL;
  while(ISSPACE(*p))
    p++;
  tp = p;
  *pdata = get_param_word(&p, &endpos, endchar);
  /* If not quoted, strip trailing spaces. */
  if(*pdata == tp)
    while(endpos > *pdata && ISSPACE(endpos[-1]))
      endpos--;
  sep = *p;
  *endpos = '\0';
  while(sep == ';') {
    while(ISSPACE(*++p))
      ;

    if(!endct && checkprefix("type=", p)) {
      for(p += 5; ISSPACE(*p); p++)
        ;
      /* set type pointer */
      type = p;

      /* verify that this is a fine type specifier */
      if(2 != sscanf(type, "%127[^/ ]/%127[^;, \n]", type_major, type_minor)) {
        warnf(config->global, "Illegally formatted content-type field!\n");
        curl_slist_free_all(headers);
        return -1; /* illegal content-type syntax! */
      }

      /* now point beyond the content-type specifier */
      p = type + strlen(type_major) + strlen(type_minor) + 1;
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else if(checkprefix("filename=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 9; ISSPACE(*p); p++)
        ;
      tp = p;
      filename = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(filename == tp)
        while(endpos > filename && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(checkprefix("headers=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      p += 8;
      if(*p == '@' || *p == '<') {
        char *hdrfile;
        FILE *fp;
        /* Read headers from a file. */

        do {
          p++;
        } while(ISSPACE(*p));
        tp = p;
        hdrfile = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdrfile == tp)
          while(endpos > hdrfile && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        /* TODO: maybe special fopen for VMS? */
        fp = fopen(hdrfile, FOPEN_READTEXT);
        if(!fp)
          warnf(config->global, "Cannot read from %s: %s\n", hdrfile,
                strerror(errno));
        else {
          int i = read_field_headers(config, hdrfile, fp, &headers);

          fclose(fp);
          if(i) {
            curl_slist_free_all(headers);
            return -1;
          }
        }
      }
      else {
        char *hdr;

        while(ISSPACE(*p))
          p++;
        tp = p;
        hdr = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdr == tp)
          while(endpos > hdr && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        if(slist_append(&headers, hdr)) {
          fprintf(config->global->errors, "Out of memory for field header!\n");
          curl_slist_free_all(headers);
          return -1;
        }
      }
    }
    else if(checkprefix("encoder=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 8; ISSPACE(*p); p++)
        ;
      tp = p;
      encoder = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(encoder == tp)
        while(endpos > encoder && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(endct) {
      /* This is part of content type. */
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else {
      /* unknown prefix, skip to next block */
      char *unknown = get_param_word(&p, &endpos, endchar);

      sep = *p;
      *endpos = '\0';
      if(*unknown)
        warnf(config->global, "skip unknown form field: %s\n", unknown);
    }
  }

  /* Terminate content type. */
  if(endct)
    *endct = '\0';

  if(ptype)
    *ptype = type;
  else if(type)
    warnf(config->global, "Field content type not allowed here: %s\n", type);

  if(pfilename)
    *pfilename = filename;
  else if(filename)
    warnf(config->global,
          "Field file name not allowed here: %s\n", filename);

  if(pencoder)
    *pencoder = encoder;
  else if(encoder)
    warnf(config->global,
          "Field encoder not allowed here: %s\n", encoder);

  if(pheaders)
    *pheaders = headers;
  else if(headers) {
    warnf(config->global,
          "Field headers not allowed here: %s\n", headers->data);
    curl_slist_free_all(headers);
  }

  *str = p;
  return sep & 0xFF;
}